

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

int ResetRequestRPLIDARx(RPLIDAR *pRPLIDAR)

{
  int iVar1;
  
  iVar1 = ResetRequestRPLIDAR(pRPLIDAR);
  return iVar1;
}

Assistant:

HARDWAREX_API int ResetRequestRPLIDARx(RPLIDAR* pRPLIDAR)
{
	return ResetRequestRPLIDAR(pRPLIDAR);
}